

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

int __thiscall
QTextDocumentPrivate::remove_string(QTextDocumentPrivate *this,int pos,uint length,Operation op)

{
  QChar QVar1;
  uint uVar2;
  uint uVar3;
  QTextFrame *pQVar4;
  QTextFramePrivate *this_00;
  int in_EDX;
  QTextDocumentPrivate *in_RDI;
  int w;
  int in_stack_0000002c;
  QTextFrame *frame;
  uint x;
  int b;
  undefined8 in_stack_ffffffffffffffa8;
  uint index;
  QFragmentMap<QTextBlockData> *in_stack_ffffffffffffffb0;
  BlockMap *this_01;
  undefined4 in_stack_ffffffffffffffc0;
  Operation op_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar2 = QFragmentMap<QTextBlockData>::findNode
                    (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                     (uint)in_stack_ffffffffffffffa8);
  uVar3 = QFragmentMap<QTextFragmentData>::findNode
                    ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffffb0,
                     (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),(uint)in_stack_ffffffffffffffa8
                    );
  this_01 = &in_RDI->blocks;
  QFragmentMap<QTextBlockData>::size
            (in_stack_ffffffffffffffb0,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
             (uint)in_stack_ffffffffffffffa8);
  index = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  QFragmentMap<QTextBlockData>::setSize
            ((QFragmentMap<QTextBlockData> *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
             (uint)((ulong)this_01 >> 0x20),(int)this_01,
             (uint)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  QFragmentMap<QTextFragmentData>::fragment
            ((QFragmentMap<QTextFragmentData> *)in_stack_ffffffffffffffb0,index);
  objectForFormat(in_RDI,uVar2);
  pQVar4 = qobject_cast<QTextFrame*>((QObject *)0x7d3181);
  if (pQVar4 != (QTextFrame *)0x0) {
    this_00 = QTextFrame::d_func((QTextFrame *)0x7d3198);
    QFragmentMap<QTextFragmentData>::fragment
              ((QFragmentMap<QTextFragmentData> *)this_00,(uint)((ulong)&in_RDI->text >> 0x20));
    QVar1 = QString::at((QString *)this_01,(qsizetype)this_00);
    (**(code **)(*(long *)&this_00->super_QTextObjectPrivate + 0x28))
              (this_00,QVar1.ucs,uVar3,QVar1.ucs);
    in_RDI->framesDirty = true;
  }
  op_00 = (Operation)((ulong)pQVar4 >> 0x20);
  uVar2 = QFragmentMap<QTextFragmentData>::erase_single
                    ((QFragmentMap<QTextFragmentData> *)CONCAT44(uVar2,in_stack_ffffffffffffffc0),
                     (uint)((ulong)this_01 >> 0x20));
  if ((in_RDI->undoEnabled & 1U) == 0) {
    in_RDI->unreachableCharacterCount = in_EDX + in_RDI->unreachableCharacterCount;
  }
  adjustDocumentChangesAndCursors
            ((QTextDocumentPrivate *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_0000002c,w,
             op_00);
  return uVar2;
}

Assistant:

int QTextDocumentPrivate::remove_string(int pos, uint length, QTextUndoCommand::Operation op)
{
    Q_ASSERT(pos >= 0);
    Q_ASSERT(blocks.length() == fragments.length());
    Q_ASSERT(q20::cmp_greater_equal(blocks.length(), pos+length));

    int b = blocks.findNode(pos);
    uint x = fragments.findNode(pos);

    Q_ASSERT(blocks.size(b) > length);
    Q_ASSERT(x && q20::cmp_equal(fragments.position(x), pos) && fragments.size(x) == length);
    Q_ASSERT(noBlockInString(QStringView{text}.mid(fragments.fragment(x)->stringPosition, length)));

    blocks.setSize(b, blocks.size(b)-length);

    QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(fragments.fragment(x)->format));
    if (frame) {
        frame->d_func()->fragmentRemoved(text.at(fragments.fragment(x)->stringPosition), x);
        framesDirty = true;
    }

    const int w = fragments.erase_single(x);

    if (!undoEnabled)
        unreachableCharacterCount += length;

    adjustDocumentChangesAndCursors(pos, -int(length), op);

    return w;
}